

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O1

bool __thiscall Catch::TestSpecParser::processOtherChar(TestSpecParser *this,char c)

{
  bool bVar1;
  
  switch(this->m_mode) {
  case None:
    bVar1 = c == '~';
    break;
  case Name:
    bVar1 = c == '[';
    break;
  case QuotedName:
    bVar1 = c == '\"';
    break;
  case Tag:
    bVar1 = (c + 0xa5U & 0xfd) == 0;
    break;
  case EscapedName:
    bVar1 = true;
    break;
  default:
    bVar1 = false;
  }
  if (bVar1 != false) {
    std::__cxx11::string::push_back((char)this + '@');
    endMode(this);
  }
  return bVar1;
}

Assistant:

bool TestSpecParser::processOtherChar( char c ) {
        if( !isControlChar( c ) )
            return false;
        m_substring += c;
        endMode();
        return true;
    }